

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.h
# Opt level: O3

float Ptex::v2_2::PtexBicubicFilter::kernelFn(float x,float *c)

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = ABS(x);
  if (1.0 <= fVar2) {
    if (2.0 <= fVar2) {
      return 0.0;
    }
    fVar3 = (c[3] * fVar2 + c[4]) * fVar2 + c[5];
    lVar1 = 0x18;
  }
  else {
    fVar3 = (*c * fVar2 + c[1]) * fVar2;
    lVar1 = 8;
  }
  return fVar3 * fVar2 + *(float *)((long)c + lVar1);
}

Assistant:

inline float abs(float x)
{
    union {
        float f;
        int32_t i;
    };
    f = x;
    i &= 0x7fffffff;
    return f;
}